

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.cpp
# Opt level: O0

string * __thiscall
Test::Formats::to_string_abi_cxx11_(string *__return_storage_ptr__,Formats *this,double val)

{
  allocator<char> local_99;
  char local_98 [8];
  char buffer [128];
  double val_local;
  
  buffer._120_8_ = val;
  snprintf(local_98,0x80,"%g",val);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_98,&local_99);
  std::allocator<char>::~allocator(&local_99);
  return __return_storage_ptr__;
}

Assistant:

std::string Formats::to_string(double val) {
  char buffer[128];
#ifdef _MSC_VER
  sprintf_s(buffer, sizeof(buffer), "%g", val);
#else
  snprintf(buffer, sizeof(buffer), "%g", val);
#endif
  return buffer;
}